

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf.hpp
# Opt level: O0

bool UTF_u8_to_U<(char)63>(UTF_US8 *us8,UTF_US32 *us32)

{
  bool bVar1;
  int iVar2;
  reference puVar3;
  int local_48;
  int i;
  int count;
  __normal_iterator<const_unsigned_char_*,_std::__cxx11::basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>_>
  local_38;
  const_iterator end;
  const_iterator it;
  UTF_UC32 uc32;
  UTF_UC8 uc8 [4];
  UTF_US32 *us32_local;
  UTF_US8 *us8_local;
  
  __gnu_cxx::
  __normal_iterator<const_unsigned_char_*,_std::__cxx11::basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>_>
  ::__normal_iterator(&end);
  local_38._M_current =
       (uchar *)std::__cxx11::
                basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>
                ::end(us8);
  end = std::__cxx11::
        basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>
        ::begin(us8);
  do {
    bVar1 = __gnu_cxx::operator!=(&end,&local_38);
    if (!bVar1) {
      return true;
    }
    puVar3 = __gnu_cxx::
             __normal_iterator<const_unsigned_char_*,_std::__cxx11::basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>_>
             ::operator*(&end);
    iVar2 = UTF_uc8_count(*puVar3);
    if (iVar2 == 0) {
      std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::
      push_back(us32,L'?');
    }
    else {
      puVar3 = __gnu_cxx::
               __normal_iterator<const_unsigned_char_*,_std::__cxx11::basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>_>
               ::operator*(&end);
      it._M_current._4_1_ = *puVar3;
      for (local_48 = 1; local_48 < iVar2; local_48 = local_48 + 1) {
        __gnu_cxx::
        __normal_iterator<const_unsigned_char_*,_std::__cxx11::basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>_>
        ::operator++(&end);
        bVar1 = __gnu_cxx::operator==(&end,&local_38);
        if (bVar1) {
          std::__cxx11::
          basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::push_back
                    (us32,L'?');
          return true;
        }
        puVar3 = __gnu_cxx::
                 __normal_iterator<const_unsigned_char_*,_std::__cxx11::basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>_>
                 ::operator*(&end);
        *(uchar *)((long)&it._M_current + (long)local_48 + 4) = *puVar3;
      }
      bVar1 = UTF_uc8_to_uc32((UTF_UC8 *)((long)&it._M_current + 4),(UTF_UC32 *)&it);
      if (bVar1) {
        std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
        ::push_back(us32,(char32_t)it._M_current);
      }
      else {
        std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
        ::push_back(us32,L'?');
      }
    }
    __gnu_cxx::
    __normal_iterator<const_unsigned_char_*,_std::__cxx11::basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>_>
    ::operator++(&end);
  } while( true );
}

Assistant:

inline bool
UTF_u8_to_U(const UTF_US8& us8, UTF_US32& us32)
{
    UTF_UC8 uc8[4];
    UTF_UC32 uc32;
    UTF_US8::const_iterator it, end = us8.end();
    for (it = us8.begin(); it != end; ++it)
    {
        int count = UTF_uc8_count(UTF_STATIC_CAST(UTF_UC8, *it));
        if (!count)
        {
            if (!t_default_char)
                return false;

            us32.push_back(UTF_STATIC_CAST(UTF_UC8, t_default_char));
            continue;
        }

        uc8[0] = *it;
        for (int i = 1; i < count; ++i)
        {
            ++it;
            if (it == end)
            {
                if (!t_default_char)
                    return false;

                us32.push_back(UTF_STATIC_CAST(UTF_UC8, t_default_char));
                return true;
            }
            uc8[i] = *it;
        }

        if (!UTF_uc8_to_uc32(uc8, &uc32))
        {
            if (!t_default_char)
                return false;

            us32.push_back(UTF_STATIC_CAST(UTF_UC8, t_default_char));
            continue;
        }

        us32.push_back(uc32);
    }
    return true;
}